

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

void * PAL_LoadLibraryDirect(LPCWSTR lpLibFileName)

{
  undefined8 lpPath;
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  int local_6c;
  undefined1 local_68 [4];
  INT name_length;
  PathCharString pathstr;
  
  pathstr.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  pathstr._32_8_ = local_68;
  pathstr.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00334629;
  bVar1 = LOADVerifyLibraryPath<char16_t>(lpLibFileName);
  if (bVar1) {
    sVar2 = PAL_wcslen(lpLibFileName);
    StackString<32UL,_char>::Resize
              ((StackString<32UL,_char> *)local_68,(long)MaxWCharToAcpLength * (sVar2 + 1));
    lpPath = pathstr._32_8_;
    if (pathstr._32_8_ == 0) goto LAB_003345fb;
    bVar1 = LOADConvertLibraryPathWideStringToMultibyteString
                      (lpLibFileName,(LPSTR)pathstr._32_8_,&local_6c);
    if (!bVar1) goto LAB_003345fb;
    FILEDosToUnixPathA((LPSTR)lpPath);
    if ((ulong)(long)local_6c < pathstr.m_size) {
      pathstr.m_size = (long)local_6c;
    }
    *(undefined1 *)(pathstr._32_8_ + pathstr.m_size) = 0;
    pvVar3 = LOADLoadLibraryDirect((LPCSTR)lpPath);
  }
  else {
LAB_003345fb:
    pvVar3 = (void *)0x0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_68);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == pathstr.m_count) {
      return pvVar3;
    }
    __stack_chk_fail();
  }
LAB_00334629:
  abort();
}

Assistant:

void *
PALAPI
PAL_LoadLibraryDirect(
    IN LPCWSTR lpLibFileName)
{
    PathCharString pathstr;
    CHAR * lpstr = nullptr;
    INT name_length;
    void *dl_handle = nullptr;

    PERF_ENTRY(LoadLibraryDirect);
    ENTRY("LoadLibraryDirect (lpLibFileName=%p (%S)) \n",
          lpLibFileName ? lpLibFileName : W16_NULLSTRING,
          lpLibFileName ? lpLibFileName : W16_NULLSTRING);

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto done;
    }

    lpstr = pathstr.OpenStringBuffer((PAL_wcslen(lpLibFileName)+1) * MaxWCharToAcpLength);
    if (nullptr == lpstr)
    {
        goto done;
    }
    if (!LOADConvertLibraryPathWideStringToMultibyteString(lpLibFileName, lpstr, &name_length))
    {
        goto done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    FILEDosToUnixPathA(lpstr);
    pathstr.CloseBuffer(name_length);

    dl_handle = LOADLoadLibraryDirect(lpstr);

done:
    LOGEXIT("LoadLibraryDirect returns HMODULE %p\n", dl_handle);
    PERF_EXIT(LoadLibraryDirect);
    return dl_handle;
}